

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

size_t mz_zip_reader_extract_iter_read
                 (mz_zip_reader_extract_iter_state *pState,void *pvBuf,size_t buf_size)

{
  mz_uint32 decomp_flags;
  tinfl_status tVar1;
  mz_uint8 *pmVar2;
  mz_ulong mVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  size_t local_98;
  undefined8 local_90;
  mz_uint8 *local_88;
  size_t to_copy;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint8 *pWrite_buf_cur;
  size_t copied_to_caller;
  size_t buf_size_local;
  void *pvBuf_local;
  mz_zip_reader_extract_iter_state *pState_local;
  undefined4 local_14;
  long local_10;
  
  pWrite_buf_cur = (mz_uint8 *)0x0;
  if ((((pState == (mz_zip_reader_extract_iter_state *)0x0) ||
       (pState->pZip == (mz_zip_archive *)0x0)) ||
      (pState->pZip->m_pState == (mz_zip_internal_state *)0x0)) || (pvBuf == (void *)0x0)) {
    pState_local = (mz_zip_reader_extract_iter_state *)0x0;
  }
  else {
    copied_to_caller = buf_size;
    buf_size_local = (size_t)pvBuf;
    pvBuf_local = pState;
    if (((pState->flags & 0x400) == 0) && ((pState->file_stat).m_method != 0)) {
      do {
        in_buf_size = *(long *)((long)pvBuf_local + 0x4a8) +
                      (*(ulong *)((long)pvBuf_local + 0x38) & 0x7fff);
        to_copy = 0x8000 - (*(ulong *)((long)pvBuf_local + 0x38) & 0x7fff);
        if (*(long *)((long)pvBuf_local + 0x4b0) == 0) {
          if ((*(long *)((long)pvBuf_local + 0x28) == 0) &&
             (*(long *)(*(long *)(*pvBuf_local + 0x68) + 0x80) == 0)) {
            if (*(ulong *)((long)pvBuf_local + 0x18) < *(ulong *)((long)pvBuf_local + 0x30)) {
              local_90 = *(undefined8 *)((long)pvBuf_local + 0x18);
            }
            else {
              local_90 = *(undefined8 *)((long)pvBuf_local + 0x30);
            }
            *(undefined8 *)((long)pvBuf_local + 0x28) = local_90;
            lVar4 = (**(code **)(*pvBuf_local + 0x48))
                              (*(undefined8 *)(*pvBuf_local + 0x60),
                               *(undefined8 *)((long)pvBuf_local + 0x40),
                               *(undefined8 *)((long)pvBuf_local + 0x4a0),
                               *(undefined8 *)((long)pvBuf_local + 0x28));
            if (lVar4 != *(long *)((long)pvBuf_local + 0x28)) {
              if (*pvBuf_local != 0) {
                *(undefined4 *)(*pvBuf_local + 0x1c) = 0x14;
              }
              *(undefined4 *)((long)pvBuf_local + 0xc) = 0xffffffff;
              break;
            }
            *(long *)((long)pvBuf_local + 0x40) =
                 *(long *)((long)pvBuf_local + 0x28) + *(long *)((long)pvBuf_local + 0x40);
            *(long *)((long)pvBuf_local + 0x30) =
                 *(long *)((long)pvBuf_local + 0x30) - *(long *)((long)pvBuf_local + 0x28);
            *(undefined8 *)((long)pvBuf_local + 0x20) = 0;
          }
          out_buf_size = *(size_t *)((long)pvBuf_local + 0x28);
          decomp_flags = 0;
          if (*(long *)((long)pvBuf_local + 0x30) != 0) {
            decomp_flags = 2;
          }
          tVar1 = tinfl_decompress((tinfl_decompressor *)((long)pvBuf_local + 0x4b8),
                                   (mz_uint8 *)
                                   (*(long *)((long)pvBuf_local + 0x4a0) +
                                   *(long *)((long)pvBuf_local + 0x20)),&out_buf_size,
                                   *(mz_uint8 **)((long)pvBuf_local + 0x4a8),(mz_uint8 *)in_buf_size
                                   ,&to_copy,decomp_flags);
          *(tinfl_status *)((long)pvBuf_local + 0xc) = tVar1;
          *(size_t *)((long)pvBuf_local + 0x28) = *(long *)((long)pvBuf_local + 0x28) - out_buf_size
          ;
          *(size_t *)((long)pvBuf_local + 0x20) = out_buf_size + *(long *)((long)pvBuf_local + 0x20)
          ;
          *(size_t *)((long)pvBuf_local + 0x4b0) = to_copy;
        }
        if (*(long *)((long)pvBuf_local + 0x4b0) != 0) {
          if (copied_to_caller - (long)pWrite_buf_cur < *(ulong *)((long)pvBuf_local + 0x4b0)) {
            local_98 = copied_to_caller - (long)pWrite_buf_cur;
          }
          else {
            local_98 = *(size_t *)((long)pvBuf_local + 0x4b0);
          }
          memcpy(pWrite_buf_cur + buf_size_local,(void *)in_buf_size,local_98);
          mVar3 = mz_crc32((ulong)*(uint *)((long)pvBuf_local + 0x10),(mz_uint8 *)in_buf_size,
                           local_98);
          *(int *)((long)pvBuf_local + 0x10) = (int)mVar3;
          *(size_t *)((long)pvBuf_local + 0x4b0) = *(long *)((long)pvBuf_local + 0x4b0) - local_98;
          uVar5 = local_98 + *(long *)((long)pvBuf_local + 0x38);
          *(ulong *)((long)pvBuf_local + 0x38) = uVar5;
          if (*(ulong *)((long)pvBuf_local + 0x78) < uVar5) {
            if (*pvBuf_local != 0) {
              *(undefined4 *)(*pvBuf_local + 0x1c) = 0xb;
            }
            *(undefined4 *)((long)pvBuf_local + 0xc) = 0xffffffff;
            break;
          }
          pWrite_buf_cur = pWrite_buf_cur + local_98;
        }
        bVar6 = false;
        if ((pWrite_buf_cur < copied_to_caller) &&
           (bVar6 = true, *(int *)((long)pvBuf_local + 0xc) != 1)) {
          bVar6 = *(int *)((long)pvBuf_local + 0xc) == 2;
        }
      } while (bVar6);
    }
    else {
      local_88 = (mz_uint8 *)buf_size;
      if (pState->comp_remaining <= buf_size) {
        local_88 = (mz_uint8 *)pState->comp_remaining;
      }
      pWrite_buf_cur = local_88;
      if (pState->pZip->m_pState->m_pMem == (void *)0x0) {
        pmVar2 = (mz_uint8 *)
                 (*pState->pZip->m_pRead)
                           (pState->pZip->m_pIO_opaque,pState->cur_file_ofs,pvBuf,(size_t)local_88);
        if (pmVar2 != pWrite_buf_cur) {
          local_10 = *pvBuf_local;
          local_14 = 0x14;
          if (local_10 != 0) {
            *(undefined4 *)(local_10 + 0x1c) = 0x14;
          }
          *(undefined4 *)((long)pvBuf_local + 0xc) = 0xffffffff;
          pWrite_buf_cur = (mz_uint8 *)0x0;
        }
      }
      else {
        memcpy(pvBuf,pState->pRead_buf,(size_t)local_88);
        *(mz_uint8 **)((long)pvBuf_local + 0x4a0) =
             pWrite_buf_cur + *(long *)((long)pvBuf_local + 0x4a0);
      }
      if ((*(uint *)((long)pvBuf_local + 8) & 0x400) == 0) {
        mVar3 = mz_crc32((ulong)*(uint *)((long)pvBuf_local + 0x10),(mz_uint8 *)buf_size_local,
                         (size_t)pWrite_buf_cur);
        *(int *)((long)pvBuf_local + 0x10) = (int)mVar3;
      }
      *(mz_uint8 **)((long)pvBuf_local + 0x40) =
           pWrite_buf_cur + *(long *)((long)pvBuf_local + 0x40);
      *(mz_uint8 **)((long)pvBuf_local + 0x38) =
           pWrite_buf_cur + *(long *)((long)pvBuf_local + 0x38);
      *(long *)((long)pvBuf_local + 0x30) =
           *(long *)((long)pvBuf_local + 0x30) - (long)pWrite_buf_cur;
    }
    pState_local = (mz_zip_reader_extract_iter_state *)pWrite_buf_cur;
  }
  return (size_t)pState_local;
}

Assistant:

size_t mz_zip_reader_extract_iter_read(mz_zip_reader_extract_iter_state* pState, void* pvBuf, size_t buf_size)
{
    size_t copied_to_caller = 0;

    /* Argument sanity check */
    if ((!pState) || (!pState->pZip) || (!pState->pZip->m_pState) || (!pvBuf))
        return 0;

    if ((pState->flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!pState->file_stat.m_method))
    {
        /* The file is stored or the caller has requested the compressed data, calc amount to return. */
        copied_to_caller = (size_t)MZ_MIN( buf_size, pState->comp_remaining );

        /* Zip is in memory....or requires reading from a file? */
        if (pState->pZip->m_pState->m_pMem)
        {
            /* Copy data to caller's buffer */
            memcpy( pvBuf, pState->pRead_buf, copied_to_caller );
            pState->pRead_buf = ((mz_uint8*)pState->pRead_buf) + copied_to_caller;
        }
        else
        {
            /* Read directly into caller's buffer */
            if (pState->pZip->m_pRead(pState->pZip->m_pIO_opaque, pState->cur_file_ofs, pvBuf, copied_to_caller) != copied_to_caller)
            {
                /* Failed to read all that was asked for, flag failure and alert user */
                mz_zip_set_error(pState->pZip, MZ_ZIP_FILE_READ_FAILED);
                pState->status = TINFL_STATUS_FAILED;
                copied_to_caller = 0;
            }
        }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        /* Compute CRC if not returning compressed data only */
        if (!(pState->flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
            pState->file_crc32 = (mz_uint32)mz_crc32(pState->file_crc32, (const mz_uint8 *)pvBuf, copied_to_caller);
#endif

        /* Advance offsets, dec counters */
        pState->cur_file_ofs += copied_to_caller;
        pState->out_buf_ofs += copied_to_caller;
        pState->comp_remaining -= copied_to_caller;
    }
    else
    {
        do
        {
            /* Calc ptr to write buffer - given current output pos and block size */
            mz_uint8 *pWrite_buf_cur = (mz_uint8 *)pState->pWrite_buf + (pState->out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));

            /* Calc max output size - given current output pos and block size */
            size_t in_buf_size, out_buf_size = TINFL_LZ_DICT_SIZE - (pState->out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));

            if (!pState->out_blk_remain)
            {
                /* Read more data from file if none available (and reading from file) */
                if ((!pState->read_buf_avail) && (!pState->pZip->m_pState->m_pMem))
                {
                    /* Calc read size */
                    pState->read_buf_avail = MZ_MIN(pState->read_buf_size, pState->comp_remaining);
                    if (pState->pZip->m_pRead(pState->pZip->m_pIO_opaque, pState->cur_file_ofs, pState->pRead_buf, (size_t)pState->read_buf_avail) != pState->read_buf_avail)
                    {
                        mz_zip_set_error(pState->pZip, MZ_ZIP_FILE_READ_FAILED);
                        pState->status = TINFL_STATUS_FAILED;
                        break;
                    }

                    /* Advance offsets, dec counters */
                    pState->cur_file_ofs += pState->read_buf_avail;
                    pState->comp_remaining -= pState->read_buf_avail;
                    pState->read_buf_ofs = 0;
                }

                /* Perform decompression */
                in_buf_size = (size_t)pState->read_buf_avail;
                pState->status = tinfl_decompress(&pState->inflator, (const mz_uint8 *)pState->pRead_buf + pState->read_buf_ofs, &in_buf_size, (mz_uint8 *)pState->pWrite_buf, pWrite_buf_cur, &out_buf_size, pState->comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
                pState->read_buf_avail -= in_buf_size;
                pState->read_buf_ofs += in_buf_size;

                /* Update current output block size remaining */
                pState->out_blk_remain = out_buf_size;
            }

            if (pState->out_blk_remain)
            {
                /* Calc amount to return. */
                size_t to_copy = MZ_MIN( (buf_size - copied_to_caller), pState->out_blk_remain );

                /* Copy data to caller's buffer */
                memcpy( (uint8_t*)pvBuf + copied_to_caller, pWrite_buf_cur, to_copy );

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                /* Perform CRC */
                pState->file_crc32 = (mz_uint32)mz_crc32(pState->file_crc32, pWrite_buf_cur, to_copy);
#endif

                /* Decrement data consumed from block */
                pState->out_blk_remain -= to_copy;

                /* Inc output offset, while performing sanity check */
                if ((pState->out_buf_ofs += to_copy) > pState->file_stat.m_uncomp_size)
                {
                    mz_zip_set_error(pState->pZip, MZ_ZIP_DECOMPRESSION_FAILED);
                    pState->status = TINFL_STATUS_FAILED;
                    break;
                }

                /* Increment counter of data copied to caller */
                copied_to_caller += to_copy;
            }
        } while ( (copied_to_caller < buf_size) && ((pState->status == TINFL_STATUS_NEEDS_MORE_INPUT) || (pState->status == TINFL_STATUS_HAS_MORE_OUTPUT)) );
    }

    /* Return how many bytes were copied into user buffer */
    return copied_to_caller;
}